

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wheel.hpp
# Opt level: O0

void __thiscall
primesum::Wheel::Wheel<std::vector<int,std::allocator<int>>>
          (Wheel *this,vector<int,_std::allocator<int>_> *primes,int64_t size,int64_t low)

{
  reference pvVar1;
  vector<primesum::WheelItem,_std::allocator<primesum::WheelItem>_> *this_00;
  long in_RCX;
  long in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  int64_t wheel_index;
  int64_t next_multiple_factor;
  int64_t multiple;
  int64_t quotient;
  int64_t prime;
  int64_t b;
  int *in_stack_ffffffffffffff70;
  int *in_stack_ffffffffffffff78;
  vector<primesum::WheelItem,_std::allocator<primesum::WheelItem>_> *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff98;
  vector<primesum::WheelItem,_std::allocator<primesum::WheelItem>_> *in_stack_ffffffffffffffa0;
  size_type local_40;
  
  std::vector<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>::vector
            ((vector<primesum::WheelItem,_std::allocator<primesum::WheelItem>_> *)0x146f4e);
  std::vector<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>::reserve
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::vector<primesum::WheelItem,std::allocator<primesum::WheelItem>>::emplace_back<int,int>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  for (local_40 = 1; (long)local_40 < in_RDX; local_40 = local_40 + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,local_40);
    this_00 = (vector<primesum::WheelItem,_std::allocator<primesum::WheelItem>_> *)
              ceil_div<long,long>(in_RCX,(long)*pvVar1);
    std::vector<primesum::WheelItem,std::allocator<primesum::WheelItem>>::emplace_back<long&,long&>
              (this_00,(long *)init,(long *)0x4e04e04e04e04e05);
  }
  return;
}

Assistant:

Wheel(Primes& primes,
        int64_t size,
        int64_t low)
  {
    wheel_.reserve(size);
    wheel_.emplace_back(0, 0);

    for (int64_t b = 1; b < size; b++)
    {
      int64_t prime = primes[b];
      int64_t quotient = ceil_div(low, prime);

      // first multiple >= low
      int64_t multiple = prime * quotient;

      // calculate the next multiple of prime that
      // is not divisible by any of the wheel's
      // prime factors (2, 3, 5, 7)
      int64_t next_multiple_factor = init[quotient % 210].next_multiple_factor;
      int64_t wheel_index = init[quotient % 210].wheel_index;
      multiple += prime * next_multiple_factor;

      wheel_.emplace_back(multiple, wheel_index);
    }
  }